

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiz-spoil.c
# Opt level: O0

void spoil_obj_desc(char *fname)

{
  ushort uVar1;
  _Bool _Var2;
  void *p;
  size_t sVar3;
  object_kind *kind;
  size_t u8len;
  uint local_500;
  int32_t v;
  wchar_t e;
  wchar_t tmp;
  int32_t t2;
  int32_t t1;
  wchar_t e2;
  wchar_t e1;
  wchar_t i2;
  wchar_t i1;
  char *format;
  char dam [80];
  char wgt [80];
  char buf [1024];
  uint16_t *who;
  wchar_t local_20;
  wchar_t n;
  wchar_t t;
  wchar_t s;
  wchar_t k;
  wchar_t i;
  char *fname_local;
  
  who._4_4_ = L'\0';
  _i2 = "%-51s  %7s%6s%4s%9s\n";
  path_build(wgt + 0x48,0x400,ANGBAND_DIR_USER,fname);
  fh = file_open(wgt + 0x48,MODE_WRITE,FTYPE_TEXT);
  if (fh == (ang_file *)0x0) {
    msg("Cannot create spoiler file.");
    return;
  }
  p = mem_zalloc((ulong)z_info->r_max << 1);
  file_putf(fh,"Spoiler File -- Basic Items (%s)\n\n\n",buildid);
  file_putf(fh,_i2,"Description","Dam/AC","Wgt","Lev","Cost");
  file_putf(fh,_i2,"----------------------------------------","------","---","---","----");
  s = L'\0';
  do {
    if (group_item[s].name != (char *)0x0) {
      for (n = L'\0'; n < who._4_4_ + L'\xffffffff'; n = n + L'\x01') {
        for (local_20 = L'\0'; local_20 < who._4_4_ + L'\xffffffff'; local_20 = local_20 + L'\x01')
        {
          e1 = local_20;
          e2 = local_20 + L'\x01';
          kind_info((char *)0x0,0,(char *)0x0,0,(char *)0x0,0,&t1,&tmp,
                    (uint)*(ushort *)((long)p + (long)local_20 * 2));
          kind_info((char *)0x0,0,(char *)0x0,0,(char *)0x0,0,&t2,&e,
                    (uint)*(ushort *)((long)p + (long)e2 * 2));
          if ((e < tmp) || ((tmp == e && (t2 < t1)))) {
            uVar1 = *(ushort *)((long)p + (long)e1 * 2);
            v = (int32_t)uVar1;
            *(undefined2 *)((long)p + (long)e1 * 2) = *(undefined2 *)((long)p + (long)e2 * 2);
            *(ushort *)((long)p + (long)e2 * 2) = uVar1;
          }
        }
      }
      for (n = L'\0'; n < who._4_4_; n = n + L'\x01') {
        kind_info(wgt + 0x48,0x400,(char *)&format,0x50,dam + 0x48,0x50,(int *)&local_500,
                  (int32_t *)((long)&u8len + 4),(uint)*(ushort *)((long)p + (long)n * 2));
        sVar3 = utf8_strlen(wgt + 0x48);
        if (sVar3 < 0x33) {
          file_putf(fh,"  %s%*s",wgt + 0x48,(ulong)(0x33 - (int)sVar3)," ");
        }
        else {
          if (0x33 < sVar3) {
            utf8_clipto(wgt + 0x48,0x33);
          }
          file_putf(fh,"  %s",wgt + 0x48);
        }
        file_putf(fh,"%7s%6s%4d%9ld\n",&format,dam + 0x48,(ulong)local_500,(long)u8len._4_4_);
      }
      who._4_4_ = L'\0';
      if (group_item[s].tval == 0) {
        mem_free(p);
        _Var2 = file_close(fh);
        if (!_Var2) {
          msg("Cannot close spoiler file.");
          return;
        }
        msg("Successfully created a spoiler file.");
        return;
      }
      file_putf(fh,"\n\n%s\n\n",group_item[s].name);
    }
    for (t = L'\x01'; t < (int)(uint)z_info->k_max; t = t + L'\x01') {
      if ((k_info[t].tval == group_item[s].tval) &&
         (_Var2 = flag_has_dbg(k_info[t].kind_flags,4,0x12,"kind->kind_flags","KF_INSTA_ART"),
         !_Var2)) {
        *(short *)((long)p + (long)who._4_4_ * 2) = (short)t;
        who._4_4_ = who._4_4_ + L'\x01';
      }
    }
    s = s + L'\x01';
  } while( true );
}

Assistant:

void spoil_obj_desc(const char *fname)
{
	int i, k, s, t, n = 0;
	uint16_t *who;
	char buf[1024];
	char wgt[80];
	char dam[80];
	const char *format = "%-51s  %7s%6s%4s%9s\n";

	/* Open the file */
	path_build(buf, sizeof(buf), ANGBAND_DIR_USER, fname);
	fh = file_open(buf, MODE_WRITE, FTYPE_TEXT);

	/* Oops */
	if (!fh) {
		msg("Cannot create spoiler file.");
		return;
	}

	/* Allocate the "who" array */
	who = mem_zalloc(z_info->r_max * sizeof(uint16_t));

	/* Header */
	file_putf(fh, "Spoiler File -- Basic Items (%s)\n\n\n", buildid);

	/* More Header */
	file_putf(fh, format, "Description", "Dam/AC", "Wgt", "Lev", "Cost");
	file_putf(fh, format, "----------------------------------------",
	        "------", "---", "---", "----");

	/* List the groups */
	for (i = 0; true; i++) {
		/* Write out the group title */
		if (group_item[i].name) {
			/* Hack -- bubble-sort by cost and then level */
			for (s = 0; s < n - 1; s++) {
				for (t = 0; t < n - 1; t++) {
					int i1 = t;
					int i2 = t + 1;

					int e1;
					int e2;

					int32_t t1;
					int32_t t2;

					kind_info(NULL, 0, NULL, 0, NULL, 0, &e1, &t1, who[i1]);
					kind_info(NULL, 0, NULL, 0, NULL, 0, &e2, &t2, who[i2]);

					if ((t1 > t2) || ((t1 == t2) && (e1 > e2))) {
						int tmp = who[i1];
						who[i1] = who[i2];
						who[i2] = tmp;
					}
				}
			}

			/* Spoil each item */
			for (s = 0; s < n; s++) {
				int e;
				int32_t v;
				size_t u8len;

				/* Describe the kind */
				kind_info(buf, sizeof(buf), dam, sizeof(dam), wgt, sizeof(wgt),
						  &e, &v, who[s]);

				/* Dump it */
				/*
				 * Per C99, width specifications to %s measure
				 * bytes.  To align the columns if the
				 * description has characters that take
				 * multiple bytes, handle the first column
				 * separately.  If the description has
				 * decomposed characters (ones where multiple
				 * Unicode code points combine to form one
				 * printed character), the following columns
				 * will still be out of alignment, but they'll
				 * be closer to aligned than what the standard
				 * library functions would do.
				 */
				u8len = utf8_strlen(buf);
				if (u8len < 51) {
					file_putf(fh, "  %s%*s", buf,
						(int) (51 - u8len), " ");
				} else {
					if (u8len > 51) {
						utf8_clipto(buf, 51);
					}
					file_putf(fh, "  %s", buf);
				}
				file_putf(fh, "%7s%6s%4d%9ld\n", dam, wgt, e,
						  (long)(v));
			}

			/* Start a new set */
			n = 0;

			/* Notice the end */
			if (!group_item[i].tval) break;

			/* Start a new set */
			file_putf(fh, "\n\n%s\n\n", group_item[i].name);
		}

		/* Get legal item types */
		for (k = 1; k < z_info->k_max; k++) {
			struct object_kind *kind = &k_info[k];

			/* Skip wrong tvals */
			if (kind->tval != group_item[i].tval) continue;

			/* Hack -- Skip instant-artifacts */
			if (kf_has(kind->kind_flags, KF_INSTA_ART)) continue;

			/* Save the index */
			who[n++] = k;
		}
	}

	/* Free the "who" array */
	mem_free(who);

	/* Check for errors */
	if (!file_close(fh)) {
		msg("Cannot close spoiler file.");
		return;
	}

	/* Message */
	msg("Successfully created a spoiler file.");
}